

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O2

optional<std::array<int,_3UL>_>
ZXing::DataMatrix::DecodedBitStreamParser::DecodeNextTriple(BitSource *bits)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  optional<std::array<int,_3UL>_> oVar8;
  
  iVar2 = BitSource::available(bits);
  if (0xf < iVar2) {
    iVar2 = BitSource::readBits(bits,8);
    if (iVar2 != 0xfe) {
      iVar3 = BitSource::readBits(bits,8);
      uVar4 = (long)(iVar3 + iVar2 * 0x100 + -1) / 0x640;
      uVar5 = uVar4 & 0xffffffff;
      iVar2 = iVar2 * 0x100 + iVar3 + (int)uVar4 * -0x640 + -1;
      lVar1 = (long)iVar2 / 0x28;
      uVar6 = (ulong)(uint)((int)lVar1 * -0x28 + iVar2);
      uVar4 = lVar1 << 0x20;
      uVar7 = 0x100000000;
      goto LAB_0016367b;
    }
  }
  uVar5 = 0;
  uVar4 = 0;
  uVar6 = 0;
  uVar7 = 0;
LAB_0016367b:
  oVar8.super__Optional_base<std::array<int,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<int,_3UL>_>._8_8_ = uVar6 | uVar7;
  oVar8.super__Optional_base<std::array<int,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<int,_3UL>_>._M_payload._0_8_ = uVar5 | uVar4;
  return (optional<std::array<int,_3UL>_>)
         oVar8.super__Optional_base<std::array<int,_3UL>,_true,_true>._M_payload.
         super__Optional_payload_base<std::array<int,_3UL>_>;
}

Assistant:

std::optional<std::array<int, 3>> DecodeNextTriple(BitSource& bits)
{
	// Values are encoded in a 16-bit value as (1600 * C1) + (40 * C2) + C3 + 1
	// If there is less than 2 bytes left or the next byte is the unlatch codeword then the current segment has ended
	if (bits.available() < 16)
		return {};
	int firstByte = bits.readBits(8);
	if (firstByte == 254) // Unlatch codeword
		return {};

	int fullBitValue = (firstByte << 8) + bits.readBits(8) - 1;
	int a = fullBitValue / 1600;
	fullBitValue -= a * 1600;
	int b = fullBitValue / 40;
	int c = fullBitValue - b * 40;

	return {{a, b, c}};
}